

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

string * __thiscall
soul::Program::ProgramImpl::getStructNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Structure *s)

{
  RefCountedPtr<soul::Structure> *pRVar1;
  pointer ppVar2;
  pointer pcVar3;
  RefCountedPtr<soul::Structure> *pRVar4;
  pointer ppVar5;
  bool bVar6;
  string local_50;
  
  ppVar5 = (this->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppVar5 == ppVar2;
  if (!bVar6) {
    pRVar4 = (ppVar5->object->structs).structs.items;
    pRVar1 = pRVar4 + (ppVar5->object->structs).structs.numActive;
    pRVar4 = std::
             __find_if<soul::RefCountedPtr<soul::Structure>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::Structure_const>>
                       (pRVar4,pRVar1,s);
    if (pRVar4 == pRVar1) {
      do {
        ppVar5 = ppVar5 + 1;
        bVar6 = ppVar5 == ppVar2;
        if (bVar6) goto LAB_001e66fe;
        pRVar4 = (ppVar5->object->structs).structs.items;
        pRVar1 = pRVar4 + (ppVar5->object->structs).structs.numActive;
        pRVar4 = std::
                 __find_if<soul::RefCountedPtr<soul::Structure>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::Structure_const>>
                           (pRVar4,pRVar1,s);
      } while (pRVar4 == pRVar1);
    }
    if ((context->object == (Module *)0x0) || (ppVar5->object != context->object)) {
      TokenisedPathString::join(&local_50,&ppVar5->object->fullName,&s->name);
      stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (s->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (s->name)._M_string_length);
    }
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_001e66fe:
  throwInternalCompilerError("getStructNameWithQualificationIfNeeded",0xe5);
}

Assistant:

std::string getStructNameWithQualificationIfNeeded (pool_ptr<const Module> context, const Structure& s) const
    {
        for (auto& m : modules)
        {
            if (contains (m->structs.get(), s))
            {
                if (context != nullptr && m == context)
                    return s.getName();

                return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, s.getName()));
            }
        }

        SOUL_ASSERT_FALSE;
        return s.getName();
    }